

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O2

bool __thiscall
basist::basisu_lowlevel_etc1s_transcoder::decode_tables
          (basisu_lowlevel_etc1s_transcoder *this,uint8_t *pTable_data,uint32_t table_data_size)

{
  bool bVar1;
  uint32_t uVar2;
  bool bVar3;
  bitwise_decoder sym_codec;
  bitwise_decoder local_30;
  
  if (pTable_data != (uint8_t *)0x0 || table_data_size == 0) {
    local_30.m_pBuf_end = pTable_data + table_data_size;
    local_30.m_bit_buf = 0;
    local_30.m_bit_buf_size = 0;
    local_30.m_buf_size = table_data_size;
    local_30.m_pBuf = pTable_data;
    local_30.m_pBuf_start = pTable_data;
    bVar1 = bitwise_decoder::read_huffman_table(&local_30,&this->m_endpoint_pred_model);
    bVar3 = false;
    if ((bVar1) && (bVar3 = false, (this->m_endpoint_pred_model).m_code_sizes.m_size != 0)) {
      bVar1 = bitwise_decoder::read_huffman_table(&local_30,&this->m_delta_endpoint_model);
      bVar3 = false;
      if ((bVar1) && ((this->m_delta_endpoint_model).m_code_sizes.m_size != 0)) {
        bVar1 = bitwise_decoder::read_huffman_table(&local_30,&this->m_selector_model);
        bVar3 = false;
        if ((bVar1) && ((this->m_selector_model).m_code_sizes.m_size != 0)) {
          bVar1 = bitwise_decoder::read_huffman_table
                            (&local_30,&this->m_selector_history_buf_rle_model);
          bVar3 = false;
          if ((bVar1) && ((this->m_selector_history_buf_rle_model).m_code_sizes.m_size != 0)) {
            uVar2 = bitwise_decoder::get_bits(&local_30,0xd);
            this->m_selector_history_buf_size = uVar2;
            bVar3 = uVar2 != 0;
          }
        }
      }
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool init(const uint8_t *pBuf, uint32_t buf_size)
		{
			if ((!pBuf) && (buf_size))
				return false;

			m_buf_size = buf_size;
			m_pBuf = pBuf;
			m_pBuf_start = pBuf;
			m_pBuf_end = pBuf + buf_size;
			m_bit_buf = 0;
			m_bit_buf_size = 0;
			return true;
		}